

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transwarp.h
# Opt level: O1

int __thiscall transwarp::detail::thread_pool::shutdown(thread_pool *this,int __fd,int __how)

{
  pointer ptVar1;
  int iVar2;
  pointer ptVar3;
  thread *thread;
  pointer ptVar4;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex_);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  this->done_ = true;
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
  std::condition_variable::notify_all();
  ptVar1 = (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (ptVar4 = (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                _M_impl.super__Vector_impl_data._M_start; ptVar4 != ptVar1; ptVar4 = ptVar4 + 1) {
    std::thread::join();
  }
  ptVar4 = (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_start;
  ptVar1 = (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_finish;
  ptVar3 = ptVar4;
  if (ptVar1 != ptVar4) {
    do {
      if ((ptVar3->_M_id)._M_thread != 0) {
        std::terminate();
      }
      ptVar3 = ptVar3 + 1;
    } while (ptVar3 != ptVar1);
    (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_finish = ptVar4;
  }
  return (int)ptVar4;
}

Assistant:

void shutdown() {
        {
            std::lock_guard<std::mutex> lock(mutex_);
            done_ = true;
        }
        cond_var_.notify_all();
        for (std::thread& thread : threads_) {
            thread.join();
        }
        threads_.clear();
    }